

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d1_both.cc
# Opt level: O2

bool __thiscall
bssl::dtls1_process_handshake_fragments
          (bssl *this,SSL *ssl,uint8_t *out_alert,DTLSRecordNumber record_number,
          Span<const_unsigned_char> record)

{
  byte *pbVar1;
  undefined1 auVar2 [16];
  size_t sVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  uint16_t uVar7;
  int iVar8;
  size_t sVar9;
  ushort uVar10;
  ulong uVar11;
  undefined1 uVar12;
  int line;
  ulong pos;
  ulong uVar13;
  long lVar14;
  DTLSIncomingMessage *this_00;
  Span<const_unsigned_char> SVar15;
  Span<unsigned_char> SVar16;
  OPENSSL_timeval now;
  pointer __p;
  _Head_base<0UL,_bssl::DTLSIncomingMessage_*,_false> local_d0;
  hm_header_st msg_hdr;
  ScopedCBB cbb;
  CBS body;
  CBS cbs;
  
  cbs.len = (size_t)record.data_;
  bVar5 = false;
  bVar6 = false;
  cbs.data = (uint8_t *)record_number.combined_;
LAB_00167c34:
  sVar3 = cbs.len;
  if (cbs.len != 0) {
    bVar4 = dtls1_parse_fragment(&cbs,&msg_hdr,&body);
    if (bVar4) {
      uVar13 = (ulong)msg_hdr.msg_len;
      pos = (ulong)msg_hdr.frag_off;
      if ((msg_hdr.frag_off <= msg_hdr.msg_len) &&
         (uVar11 = (ulong)msg_hdr.frag_len, uVar11 <= uVar13 - pos)) goto code_r0x00167c80;
      iVar8 = 0x6d;
      line = 0x111;
      goto LAB_00168052;
    }
    ERR_put_error(0x10,0,0x6d,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_both.cc"
                  ,0x108);
    uVar12 = 0x32;
    goto LAB_0016807b;
  }
  if (bVar6) {
    dtls1_stop_timer((SSL *)this);
    dtls_clear_outgoing_messages((SSL *)this);
  }
  if (!bVar5) {
    MRUQueue<bssl::DTLSRecordNumber,_32UL>::PushBack
              ((MRUQueue<bssl::DTLSRecordNumber,_32UL> *)(*(long *)(this + 0x38) + 0x2b0),
               (DTLSRecordNumber)out_alert);
    bVar6 = ssl_has_final_version((SSL *)this);
    if ((((bVar6) && (uVar7 = ssl_protocol_version((SSL *)this), 0x303 < uVar7)) &&
        (bVar6 = DTLSTimer::IsSet((DTLSTimer *)(*(long *)(this + 0x38) + 0x3e0)), !bVar6)) &&
       ((**(byte **)(this + 0x38) & 0x40) == 0)) {
      now = ssl_ctx_get_current_time(*(SSL_CTX **)(this + 0x68));
      DTLSTimer::StartMicroseconds
                ((DTLSTimer *)(*(long *)(this + 0x38) + 0x3e0),now,
                 (ulong)*(uint *)(*(long *)(this + 0x38) + 0x3f0) * 0xfa);
    }
  }
LAB_00168083:
  return sVar3 == 0;
code_r0x00167c80:
  pbVar1 = *(byte **)(this + 0x38);
  if ((msg_hdr.seq < *(ushort *)(pbVar1 + 4)) || ((*pbVar1 & 0x10) != 0)) goto LAB_00167c34;
  if ((*(short *)(pbVar1 + 8) != (short)((ulong)out_alert >> 0x30)) ||
     (*(long *)(pbVar1 + 0x90) != 0)) {
    ERR_put_error(0x10,0,0xff,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_both.cc"
                  ,0x126);
    uVar12 = 10;
    goto LAB_0016807b;
  }
  sVar9 = ssl_max_handshake_message_len((SSL *)this);
  if (sVar9 < uVar13) {
    iVar8 = 0x96;
    line = 300;
LAB_00168052:
    ERR_put_error(0x10,0,iVar8,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_both.cc"
                  ,line);
    uVar12 = 0x2f;
    goto LAB_0016807b;
  }
  iVar8 = SSL_in_init((SSL *)this);
  if ((iVar8 != 0) && (bVar4 = ssl_has_final_version((SSL *)this), bVar4)) {
    uVar7 = ssl_protocol_version((SSL *)this);
    bVar6 = (bool)(bVar6 | 0x303 < uVar7);
  }
  uVar10 = *(ushort *)(*(long *)(this + 0x38) + 4);
  iVar8 = (uint)msg_hdr.seq - (uint)uVar10;
  if (7 < iVar8) {
    bVar5 = true;
    goto LAB_00167c34;
  }
  uVar12 = 0x50;
  if ((msg_hdr.seq < uVar10) || (iVar8 == 7)) goto LAB_0016807b;
  uVar10 = msg_hdr.seq % 7;
  this_00 = *(DTLSIncomingMessage **)(*(long *)(this + 0x38) + 0x118 + (ulong)uVar10 * 8);
  if (this_00 != (DTLSIncomingMessage *)0x0) {
    if (this_00->seq != msg_hdr.seq) {
      __assert_fail("frag->seq == msg_hdr->seq",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_both.cc"
                    ,0xe8,
                    "DTLSIncomingMessage *bssl::dtls1_get_incoming_message(SSL *, uint8_t *, const struct hm_header_st *)"
                   );
    }
    if ((this_00->type == msg_hdr.type) &&
       (SVar15 = DTLSIncomingMessage::msg(this_00), SVar15.size_ == (ulong)msg_hdr.msg_len))
    goto LAB_00167eea;
    iVar8 = 0x98;
    line = 0xed;
    goto LAB_00168052;
  }
  CBB_zero(&cbb.ctx_);
  local_d0._M_head_impl = New<bssl::DTLSIncomingMessage>();
  if (local_d0._M_head_impl == (DTLSIncomingMessage *)0x0) {
LAB_00167e85:
    __p = (pointer)0x0;
  }
  else {
    (local_d0._M_head_impl)->type = msg_hdr.type;
    (local_d0._M_head_impl)->seq = msg_hdr.seq;
    bVar4 = Array<unsigned_char>::InitUninitialized
                      (&(local_d0._M_head_impl)->data,(ulong)(msg_hdr.msg_len + 0xc));
    if ((((!bVar4) ||
         (iVar8 = CBB_init_fixed(&cbb.ctx_,((local_d0._M_head_impl)->data).data_,0xc), iVar8 == 0))
        || (iVar8 = CBB_add_u8(&cbb.ctx_,msg_hdr.type), iVar8 == 0)) ||
       ((((iVar8 = CBB_add_u24(&cbb.ctx_,msg_hdr.msg_len), iVar8 == 0 ||
          (iVar8 = CBB_add_u16(&cbb.ctx_,msg_hdr.seq), iVar8 == 0)) ||
         ((iVar8 = CBB_add_u24(&cbb.ctx_,0), iVar8 == 0 ||
          ((iVar8 = CBB_add_u24(&cbb.ctx_,msg_hdr.msg_len), iVar8 == 0 ||
           (iVar8 = CBB_finish(&cbb.ctx_,(uint8_t **)0x0,(size_t *)0x0), iVar8 == 0)))))) ||
        (bVar4 = DTLSMessageBitmap::Init
                           (&(local_d0._M_head_impl)->reassembly,(ulong)msg_hdr.msg_len), !bVar4))))
    goto LAB_00167e85;
    __p = local_d0._M_head_impl;
    local_d0._M_head_impl = (DTLSIncomingMessage *)0x0;
  }
  std::unique_ptr<bssl::DTLSIncomingMessage,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<bssl::DTLSIncomingMessage,_bssl::internal::Deleter> *)&local_d0);
  internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::~StackAllocated(&cbb);
  lVar14 = (ulong)uVar10 * 8;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = cbb.ctx_._8_8_;
  cbb.ctx_._0_16_ = auVar2 << 0x40;
  std::__uniq_ptr_impl<bssl::DTLSIncomingMessage,_bssl::internal::Deleter>::reset
            ((__uniq_ptr_impl<bssl::DTLSIncomingMessage,_bssl::internal::Deleter> *)
             (*(long *)(this + 0x38) + lVar14 + 0x118),__p);
  std::unique_ptr<bssl::DTLSIncomingMessage,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<bssl::DTLSIncomingMessage,_bssl::internal::Deleter> *)&cbb);
  this_00 = *(DTLSIncomingMessage **)(*(long *)(this + 0x38) + 0x118 + lVar14);
  uVar12 = 0x50;
  if (this_00 != (DTLSIncomingMessage *)0x0) {
LAB_00167eea:
    SVar15 = DTLSIncomingMessage::msg(this_00);
    if (SVar15.size_ != uVar13) {
      __assert_fail("frag->msg_len() == msg_len",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_both.cc"
                    ,0x14a,
                    "bool bssl::dtls1_process_handshake_fragments(SSL *, uint8_t *, DTLSRecordNumber, Span<const uint8_t>)"
                   );
    }
    if ((this_00->reassembly).bytes_.size_ != 0) {
      if (uVar13 == 0) {
        __assert_fail("msg_len > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_both.cc"
                      ,0x150,
                      "bool bssl::dtls1_process_handshake_fragments(SSL *, uint8_t *, DTLSRecordNumber, Span<const uint8_t>)"
                     );
      }
      cbb.ctx_._0_16_ = DTLSIncomingMessage::msg(this_00);
      SVar16 = Span<unsigned_char>::subspan((Span<unsigned_char> *)&cbb,pos,body.len);
      if (body.len != 0) {
        memcpy(SVar16.data_,body.data,body.len);
      }
      DTLSMessageBitmap::MarkRange(&this_00->reassembly,pos,uVar11 + pos);
    }
    goto LAB_00167c34;
  }
LAB_0016807b:
  *(undefined1 *)&ssl->method = uVar12;
  goto LAB_00168083;
}

Assistant:

bool dtls1_process_handshake_fragments(SSL *ssl, uint8_t *out_alert,
                                       DTLSRecordNumber record_number,
                                       Span<const uint8_t> record) {
  bool implicit_ack = false;
  bool skipped_fragments = false;
  CBS cbs = record;
  while (CBS_len(&cbs) > 0) {
    // Read a handshake fragment.
    struct hm_header_st msg_hdr;
    CBS body;
    if (!dtls1_parse_fragment(&cbs, &msg_hdr, &body)) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_BAD_HANDSHAKE_RECORD);
      *out_alert = SSL_AD_DECODE_ERROR;
      return false;
    }

    const size_t frag_off = msg_hdr.frag_off;
    const size_t frag_len = msg_hdr.frag_len;
    const size_t msg_len = msg_hdr.msg_len;
    if (frag_off > msg_len || frag_len > msg_len - frag_off) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_BAD_HANDSHAKE_RECORD);
      *out_alert = SSL_AD_ILLEGAL_PARAMETER;
      return false;
    }

    if (msg_hdr.seq < ssl->d1->handshake_read_seq ||
        ssl->d1->handshake_read_overflow) {
      // Ignore fragments from the past. This is a retransmit of data we already
      // received.
      //
      // TODO(crbug.com/42290594): Use this to drive retransmits.
      continue;
    }

    if (record_number.epoch() != ssl->d1->read_epoch.epoch ||
        ssl->d1->next_read_epoch != nullptr) {
      // New messages can only arrive in the latest epoch. This can fail if the
      // record came from |prev_read_epoch|, or if it came from |read_epoch| but
      // |next_read_epoch| exists. (It cannot come from |next_read_epoch|
      // because |next_read_epoch| becomes |read_epoch| once it receives a
      // record.)
      OPENSSL_PUT_ERROR(SSL, SSL_R_EXCESS_HANDSHAKE_DATA);
      *out_alert = SSL_AD_UNEXPECTED_MESSAGE;
      return false;
    }

    if (msg_len > ssl_max_handshake_message_len(ssl)) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_EXCESSIVE_MESSAGE_SIZE);
      *out_alert = SSL_AD_ILLEGAL_PARAMETER;
      return false;
    }

    if (SSL_in_init(ssl) && ssl_has_final_version(ssl) &&
        ssl_protocol_version(ssl) >= TLS1_3_VERSION) {
      // During the handshake, if we receive any portion of the next flight, the
      // peer must have received our most recent flight. In DTLS 1.3, this is an
      // implicit ACK. See RFC 9147, Section 7.1.
      //
      // This only applies during the handshake. After the handshake, the next
      // message may be part of a post-handshake transaction. It also does not
      // apply immediately after the handshake. As a client, receiving a
      // KeyUpdate or NewSessionTicket does not imply the server has received
      // our Finished. The server may have sent those messages in half-RTT.
      implicit_ack = true;
    }

    if (msg_hdr.seq - ssl->d1->handshake_read_seq > SSL_MAX_HANDSHAKE_FLIGHT) {
      // Ignore fragments too far in the future.
      skipped_fragments = true;
      continue;
    }

    DTLSIncomingMessage *frag =
        dtls1_get_incoming_message(ssl, out_alert, &msg_hdr);
    if (frag == nullptr) {
      return false;
    }
    assert(frag->msg_len() == msg_len);

    if (frag->reassembly.IsComplete()) {
      // The message is already assembled.
      continue;
    }
    assert(msg_len > 0);

    // Copy the body into the fragment.
    Span<uint8_t> dest = frag->msg().subspan(frag_off, CBS_len(&body));
    OPENSSL_memcpy(dest.data(), CBS_data(&body), CBS_len(&body));
    frag->reassembly.MarkRange(frag_off, frag_off + frag_len);
  }

  if (implicit_ack) {
    dtls1_stop_timer(ssl);
    dtls_clear_outgoing_messages(ssl);
  }

  if (!skipped_fragments) {
    ssl->d1->records_to_ack.PushBack(record_number);

    if (ssl_has_final_version(ssl) &&
        ssl_protocol_version(ssl) >= TLS1_3_VERSION &&
        !ssl->d1->ack_timer.IsSet() && !ssl->d1->sending_ack) {
      // Schedule sending an ACK. The delay serves several purposes:
      // - If there are more records to come, we send only one ACK.
      // - If there are more records to come and the flight is now complete, we
      //   will send the reply (which implicitly ACKs the previous flight) and
      //   cancel the timer.
      // - If there are more records to come, the flight is now complete, but
      //   generating the response is delayed (e.g. a slow, async private key),
      //   the timer will fire and we send an ACK anyway.
      OPENSSL_timeval now = ssl_ctx_get_current_time(ssl->ctx.get());
      ssl->d1->ack_timer.StartMicroseconds(
          now, uint64_t{ssl->d1->timeout_duration_ms} * 1000 / 4);
    }
  }

  return true;
}